

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

llb_build_value_file_info_t *
llb_buildsystem_command_interface_get_file_info
          (llb_build_value_file_info_t *__return_storage_ptr__,llb_buildsystem_interface_t *bi_p,
          char *path)

{
  BuildSystem *pBVar1;
  FileSystem *pFVar2;
  allocator local_91;
  string local_90 [32];
  FileInfo local_70;
  llb_buildsystem_interface_t *local_20;
  BuildSystem *bi;
  char *path_local;
  llb_buildsystem_interface_t *bi_p_local;
  
  local_20 = bi_p;
  bi = (BuildSystem *)path;
  path_local = (char *)bi_p;
  pFVar2 = llbuild::buildsystem::BuildSystem::getFileSystem((BuildSystem *)bi_p);
  pBVar1 = bi;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,(char *)pBVar1,&local_91);
  (*pFVar2->_vptr_FileSystem[7])(&local_70,pFVar2,local_90);
  llbuild::capi::convertFileInfo(__return_storage_ptr__,&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return __return_storage_ptr__;
}

Assistant:

llb_build_value_file_info_t llb_buildsystem_command_interface_get_file_info(llb_buildsystem_interface_t* bi_p, const char* path) {
  auto bi = (BuildSystem*)bi_p;
  return llbuild::capi::convertFileInfo(bi->getFileSystem().getFileInfo(path));
}